

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void generateColumnTypes(Parse *pParse,SrcList *pTabList,ExprList *pEList)

{
  Vdbe *p_00;
  char *zName;
  char *zType;
  Expr *p;
  NameContext sNC;
  int i;
  Vdbe *v;
  ExprList *pEList_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  p_00 = pParse->pVdbe;
  sNC.uNC.pEList = (ExprList *)0x0;
  p = (Expr *)pParse;
  sNC.pParse = (Parse *)pTabList;
  for (sNC.pWinSelect._4_4_ = 0; sNC.pWinSelect._4_4_ < pEList->nExpr;
      sNC.pWinSelect._4_4_ = sNC.pWinSelect._4_4_ + 1) {
    zName = columnTypeImpl((NameContext *)&p,pEList->a[sNC.pWinSelect._4_4_].pExpr);
    sqlite3VdbeSetColName
              (p_00,sNC.pWinSelect._4_4_,1,zName,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void generateColumnTypes(
  Parse *pParse,      /* Parser context */
  SrcList *pTabList,  /* List of tables */
  ExprList *pEList    /* Expressions defining the result set */
){
#ifndef SQLITE_OMIT_DECLTYPE
  Vdbe *v = pParse->pVdbe;
  int i;
  NameContext sNC;
  sNC.pSrcList = pTabList;
  sNC.pParse = pParse;
  sNC.pNext = 0;
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;
    const char *zType;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
    const char *zOrigDb = 0;
    const char *zOrigTab = 0;
    const char *zOrigCol = 0;
    zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol);

    /* The vdbe must make its own copy of the column-type and other 
    ** column specific strings, in case the schema is reset before this
    ** virtual machine is deleted.
    */
    sqlite3VdbeSetColName(v, i, COLNAME_DATABASE, zOrigDb, SQLITE_TRANSIENT);
    sqlite3VdbeSetColName(v, i, COLNAME_TABLE, zOrigTab, SQLITE_TRANSIENT);
    sqlite3VdbeSetColName(v, i, COLNAME_COLUMN, zOrigCol, SQLITE_TRANSIENT);
#else
    zType = columnType(&sNC, p, 0, 0, 0);
#endif
    sqlite3VdbeSetColName(v, i, COLNAME_DECLTYPE, zType, SQLITE_TRANSIENT);
  }
#endif /* !defined(SQLITE_OMIT_DECLTYPE) */
}